

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

void __thiscall QCborContainerPrivate::compact(QCborContainerPrivate *this)

{
  iterator iVar1;
  iterator iVar2;
  char *pcVar3;
  qptrdiff qVar4;
  Element *e;
  long in_FS_OFFSET;
  size_type newUsedData;
  size_type local_60;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->usedData <= (long)((ulong)(this->data).d.size >> 1)) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char *)0x0;
    local_58.d.size = 0;
    local_60 = 0;
    iVar1 = QList<QtCbor::Element>::begin(&this->elements);
    iVar2 = QList<QtCbor::Element>::end(&this->elements);
    if (iVar1.i != iVar2.i) {
      do {
        if (((((iVar1.i)->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
              super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 2) != 0) &&
           ((((iVar1.i)->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
             super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 2) != 0)) {
          pcVar3 = (this->data).d.ptr;
          if (pcVar3 == (char *)0x0) {
            pcVar3 = &QByteArray::_empty;
          }
          qVar4 = addByteDataImpl(&local_58,&local_60,
                                  (char *)((long)(pcVar3 + ((iVar1.i)->field_0).value) + 8),
                                  *(qsizetype *)(pcVar3 + ((iVar1.i)->field_0).value));
          ((iVar1.i)->field_0).value = qVar4;
        }
        iVar1.i = iVar1.i + 1;
      } while (iVar1.i != iVar2.i);
    }
    QByteArray::operator=(&this->data,&local_58);
    this->usedData = local_60;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborContainerPrivate::compact()
{
    if (usedData > data.size() / 2)
        return;

    // 50% savings if we recreate the byte data
    QByteArray newData;
    QByteArray::size_type newUsedData = 0;
    // Compact only elements that have byte data.
    // Nested containers will be compacted when their data changes.
    for (auto &e : elements) {
        if (e.flags & Element::HasByteData) {
            if (const ByteData *b = byteData(e))
                e.value = addByteDataImpl(newData, newUsedData, b->byte(), b->len);
        }
    }
    data = newData;
    usedData = newUsedData;
}